

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void __thiscall
httplib::detail::MultipartFormDataParser::~MultipartFormDataParser(MultipartFormDataParser *this)

{
  MultipartFormData::~MultipartFormData(&this->file_);
  std::__cxx11::string::~string((string *)&this->buf_);
  std::__cxx11::string::~string((string *)&this->boundary_);
  std::__cxx11::string::~string((string *)&this->crlf_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

MultipartFormDataParser() {}